

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

int xmlRemoveProp(xmlAttrPtr cur)

{
  xmlAttrPtr local_20;
  xmlAttrPtr tmp;
  xmlAttrPtr cur_local;
  
  if (cur == (xmlAttrPtr)0x0) {
    cur_local._4_4_ = -1;
  }
  else if (cur->parent == (_xmlNode *)0x0) {
    cur_local._4_4_ = -1;
  }
  else {
    local_20 = cur->parent->properties;
    if (local_20 == cur) {
      cur->parent->properties = cur->next;
      if (cur->next != (_xmlAttr *)0x0) {
        cur->next->prev = (_xmlAttr *)0x0;
      }
      xmlFreeProp(cur);
      cur_local._4_4_ = 0;
    }
    else {
      for (; local_20 != (xmlAttrPtr)0x0; local_20 = local_20->next) {
        if (local_20->next == cur) {
          local_20->next = cur->next;
          if (local_20->next != (_xmlAttr *)0x0) {
            local_20->next->prev = local_20;
          }
          xmlFreeProp(cur);
          return 0;
        }
      }
      cur_local._4_4_ = -1;
    }
  }
  return cur_local._4_4_;
}

Assistant:

int
xmlRemoveProp(xmlAttrPtr cur) {
    xmlAttrPtr tmp;
    if (cur == NULL) {
	return(-1);
    }
    if (cur->parent == NULL) {
	return(-1);
    }
    tmp = cur->parent->properties;
    if (tmp == cur) {
        cur->parent->properties = cur->next;
		if (cur->next != NULL)
			cur->next->prev = NULL;
	xmlFreeProp(cur);
	return(0);
    }
    while (tmp != NULL) {
	if (tmp->next == cur) {
	    tmp->next = cur->next;
	    if (tmp->next != NULL)
		tmp->next->prev = tmp;
	    xmlFreeProp(cur);
	    return(0);
	}
        tmp = tmp->next;
    }
    return(-1);
}